

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

uint64_t helper_macmulf_m68k(CPUM68KState_conflict *env,uint32_t op1,uint32_t op2)

{
  ulong uVar1;
  uint uVar2;
  
  uVar1 = (ulong)op2 * (ulong)op1;
  if ((env->macsr & 0x10) != 0) {
    uVar2 = (uint)uVar1 & 0xffffff;
    if (0x800000 < uVar2) {
      return (uVar1 >> 0x18) + 1;
    }
    if (uVar2 == 0x800000) {
      return (uVar1 >> 0x18) + (ulong)((uint)(uVar1 >> 0x18) & 1);
    }
  }
  return uVar1 >> 0x18;
}

Assistant:

uint64_t HELPER(macmulf)(CPUM68KState *env, uint32_t op1, uint32_t op2)
{
    uint64_t product;
    uint32_t remainder;

    product = (uint64_t)op1 * op2;
    if (env->macsr & MACSR_RT) {
        remainder = product & 0xffffff;
        product >>= 24;
        if (remainder > 0x800000)
            product++;
        else if (remainder == 0x800000)
            product += (product & 1);
    } else {
        product >>= 24;
    }
    return product;
}